

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  byte *pbVar1;
  xmlSchemaTypeType xVar2;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypePtr pxVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlSchemaTypePtr pxVar9;
  xmlNodePtr node;
  xmlSchemaModelGroupPtr pxVar10;
  xmlSchemaParticlePtr pxVar11;
  undefined4 uVar12;
  xmlSchemaContentType xVar13;
  xmlChar *in_R8;
  char *pcVar14;
  xmlSchemaTypePtr pxVar15;
  uint uVar16;
  xmlChar *str;
  xmlSchemaTreeItemPtr_conflict effectiveContent;
  xmlChar *local_48;
  xmlSchemaTypePtr local_40;
  int local_34;
  
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  iVar7 = pctxt->nberrors;
  pxVar15 = type->baseType;
  type->flags = type->flags | 0x400000;
  if (pxVar15 == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupComplexType","missing baseType",
               (xmlChar *)0x0,in_R8);
    goto LAB_001a221a;
  }
  if ((pxVar15->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar15->flags & 0x400000) == 0)) {
    xmlSchemaTypeFixup(pxVar15,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  if ((pxVar15->flags & 0x800000) != 0) {
    return 0;
  }
  pxVar9 = type->baseType;
  local_34 = iVar7;
  if ((type->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
    if ((pxVar9->type == XML_SCHEMA_TYPE_SIMPLE) ||
       ((pxVar9->type == XML_SCHEMA_TYPE_BASIC && (pxVar9->builtInType != 0x2d)))) {
      bVar5 = false;
      uVar12 = 0;
      if ((type->flags & 2) == 0) {
        local_48 = (xmlChar *)0x0;
        pxVar8 = xmlSchemaFormatQName(&local_48,pxVar9->targetNamespace,pxVar9->name);
        pcVar14 = 
        "If using <simpleContent> and <restriction>, the base type must be a complex type. The base type \'%s\' is a simple type"
        ;
LAB_001a1d11:
        pxVar9 = (xmlSchemaTypePtr)0x0;
        goto LAB_001a1d24;
      }
    }
    else {
      xVar13 = pxVar9->contentType;
      uVar12 = 0xc04;
      bVar5 = true;
      if (xVar13 == XML_SCHEMA_CONTENT_MIXED) {
        if ((type->flags & 4) != 0) {
          iVar7 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar9->subtypes);
          bVar5 = true;
          uVar12 = 0xc04;
          if (iVar7 != 0) {
            bVar5 = false;
            uVar12 = 0;
            if (type->contentTypeDef == (xmlSchemaTypePtr)0x0) {
              local_48 = (xmlChar *)0x0;
              pxVar8 = xmlSchemaFormatQName(&local_48,pxVar9->targetNamespace,pxVar9->name);
              pcVar14 = 
              "A <simpleType> is expected among the children of <restriction>, if <simpleContent> is used and the base type \'%s\' is a complex type"
              ;
              goto LAB_001a1d11;
            }
          }
        }
      }
      else if ((xVar13 == XML_SCHEMA_CONTENT_BASIC) || (xVar13 == XML_SCHEMA_CONTENT_SIMPLE)) {
        bVar5 = false;
        uVar12 = 0;
        if (pxVar9->contentTypeDef == (xmlSchemaTypePtr)0x0) {
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
                     "Internal error: xmlSchemaCheckSRCCT, \'%s\', base type has no content type",
                     type->name,(xmlChar *)0x0,(xmlChar *)0x0);
          iVar7 = -1;
          goto LAB_001a1dff;
        }
      }
    }
    iVar7 = 0;
    if (bVar5) {
      local_40 = (xmlSchemaTypePtr)CONCAT44(local_40._4_4_,uVar12);
      local_48 = (xmlChar *)0x0;
      pcVar14 = 
      "If <simpleContent> and <restriction> is used, the base type must be a simple type or a complex type with mixed content and particle emptiable. The base type \'%s\' is none of those"
      ;
      if ((type->flags & 4) == 0) {
        pcVar14 = 
        "If <simpleContent> and <extension> is used, the base type must be a simple type. The base type \'%s\' is a complex type"
        ;
      }
      pxVar8 = xmlSchemaFormatQName(&local_48,pxVar9->targetNamespace,pxVar9->name);
      xmlSchemaPCustomErrExt
                (pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar14,
                 pxVar8,(xmlChar *)0x0,(xmlChar *)0x0);
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
        local_48 = (xmlChar *)0x0;
      }
      iVar7 = (int)local_40;
    }
  }
  else {
    iVar7 = 0;
    if ((pxVar9->type != XML_SCHEMA_TYPE_COMPLEX) && (iVar7 = 0, pxVar9->builtInType != 0x2d)) {
      local_48 = (xmlChar *)0x0;
      local_40 = (xmlSchemaTypePtr)type->node;
      pxVar8 = xmlSchemaFormatQName(&local_48,pxVar9->targetNamespace,pxVar9->name);
      pcVar14 = 
      "If using <complexContent>, the base type is expected to be a complex type. The base type \'%s\' is a simple type"
      ;
      pxVar9 = local_40;
LAB_001a1d24:
      xmlSchemaPCustomErrExt
                (pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)pxVar9,pcVar14,
                 pxVar8,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar7 = 0xc04;
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
        local_48 = (xmlChar *)0x0;
      }
    }
  }
LAB_001a1dff:
  if (iVar7 == -1) goto LAB_001a221a;
  if (iVar7 == 0) {
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
      xVar2 = pxVar15->type;
      if (((xVar2 == XML_SCHEMA_TYPE_COMPLEX) || (pxVar15->builtInType == 0x2d)) &&
         ((pxVar15->contentTypeDef != (xmlSchemaTypePtr)0x0 && ((type->flags & 4) != 0)))) {
        pxVar9 = type->contentTypeDef;
        pxVar15 = pxVar15->contentTypeDef;
        if (pxVar9 != (xmlSchemaTypePtr)0x0) {
          type->contentTypeDef = (xmlSchemaTypePtr)0x0;
          pxVar15 = pxVar9;
        }
        pxVar9 = xmlSchemaAddType(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                                  type->targetNamespace,type->node,0);
        uVar16 = 2;
        if (pxVar9 != (xmlSchemaTypePtr)0x0) {
          pxVar9->type = XML_SCHEMA_TYPE_SIMPLE;
          pxVar9->baseType = pxVar15;
          pxVar9->facets = type->facets;
          type->facets = (xmlSchemaFacetPtr)0x0;
          pxVar9->facetSet = type->facetSet;
          type->facetSet = (xmlSchemaFacetLinkPtr)0x0;
          type->contentTypeDef = pxVar9;
          if ((pxVar15->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar15->flags & 0x400000) == 0)) {
            xmlSchemaTypeFixup(pxVar15,(xmlSchemaAbstractCtxtPtr)pctxt);
          }
          iVar7 = xmlSchemaFixupSimpleTypeStageOne(pctxt,pxVar9);
          if (iVar7 != -1) {
            iVar7 = xmlSchemaFixupSimpleTypeStageTwo(pctxt,pxVar9);
            uVar16 = 2;
            if (iVar7 != -1) {
              uVar16 = (uint)(iVar7 != 0) * 3;
            }
          }
        }
        iVar7 = (*(code *)(&DAT_001e41f4 + *(int *)(&DAT_001e41f4 + (ulong)uVar16 * 4)))();
        return iVar7;
      }
      if ((((xVar2 != XML_SCHEMA_TYPE_COMPLEX) && (pxVar15->builtInType != 0x2d)) ||
          (pxVar15->contentType != XML_SCHEMA_CONTENT_MIXED)) || ((type->flags & 4) == 0)) {
        if (((xVar2 == XML_SCHEMA_TYPE_COMPLEX) || (pxVar15->builtInType == 0x2d)) &&
           ((type->flags & 2) != 0)) {
          pxVar15 = pxVar15->contentTypeDef;
          if (pxVar15 != (xmlSchemaTypePtr)0x0) {
LAB_001a205a:
            type->contentTypeDef = pxVar15;
            goto LAB_001a2061;
          }
          pxVar8 = type->name;
          pcVar14 = 
          "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <extension>ed base type is a complex type with no simple content type"
          ;
        }
        else {
          if (((xVar2 == XML_SCHEMA_TYPE_SIMPLE) ||
              ((xVar2 == XML_SCHEMA_TYPE_BASIC && (pxVar15->builtInType != 0x2d)))) &&
             ((type->flags & 2) != 0)) goto LAB_001a205a;
          pxVar8 = type->name;
          pcVar14 = 
          "Internal error: xmlSchemaTypeFixup, complex type \'%s\' with <simpleContent>: unhandled derivation case"
          ;
        }
LAB_001a2208:
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar14,
                   pxVar8,(xmlChar *)0x0,(xmlChar *)0x0);
        goto LAB_001a221a;
      }
      if ((type->contentTypeDef == (xmlSchemaTypePtr)0x0) ||
         (type->contentTypeDef->baseType == (xmlSchemaTypePtr)0x0)) {
        pxVar8 = type->name;
        pcVar14 = 
        "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <simpleContent><restriction> is missing a <simpleType> child, but was not caught by xmlSchemaCheckSRCCT()"
        ;
        goto LAB_001a2208;
      }
    }
    else {
      pxVar9 = type->subtypes;
      if (pxVar9 == (xmlSchemaTypePtr)0x0) {
LAB_001a1ef0:
        if ((type->flags & 1) == 0) {
          xVar13 = XML_SCHEMA_CONTENT_EMPTY;
          bVar5 = true;
          goto LAB_001a1f01;
        }
        if ((pxVar9 != (xmlSchemaTypePtr)0x0) &&
           (((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->type == XML_SCHEMA_TYPE_SEQUENCE)) {
LAB_001a2122:
          bVar6 = true;
          xVar13 = XML_SCHEMA_CONTENT_ELEMENTS;
          bVar5 = false;
          goto LAB_001a1f03;
        }
        pxVar9 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
        bVar5 = true;
        if (pxVar9 != (xmlSchemaTypePtr)0x0) {
          pxVar10 = xmlSchemaAddModelGroup(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
          pxVar9->id = (xmlChar *)pxVar10;
          if (pxVar10 != (xmlSchemaModelGroupPtr)0x0) {
            type->subtypes = pxVar9;
            goto LAB_001a2122;
          }
        }
      }
      else {
        xVar13 = XML_SCHEMA_CONTENT_ELEMENTS;
        if (pxVar9->type == XML_SCHEMA_TYPE_PARTICLE) {
          xVar2 = ((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->type;
          if ((((xVar2 == XML_SCHEMA_TYPE_SEQUENCE) || (xVar2 == XML_SCHEMA_TYPE_ALL)) ||
              ((xVar2 == XML_SCHEMA_TYPE_CHOICE && (*(int *)&pxVar9->ref == 0)))) &&
             (((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children == (xmlSchemaTreeItemPtr)0x0))
          goto LAB_001a1ef0;
        }
        bVar5 = false;
LAB_001a1f01:
        bVar6 = false;
LAB_001a1f03:
        type->contentType = xVar13;
        uVar16 = type->flags;
        if ((uVar16 & 4) == 0) {
          if (bVar5) {
            type->contentType = pxVar15->contentType;
            type->subtypes = pxVar15->subtypes;
            type->contentTypeDef = pxVar15->contentTypeDef;
          }
          else if (pxVar15->contentType == XML_SCHEMA_CONTENT_EMPTY) {
            if ((uVar16 & 1) != 0) goto LAB_001a1f3f;
          }
          else {
            if ((uVar16 & 1) != 0) {
              type->contentType = XML_SCHEMA_CONTENT_MIXED;
            }
            pxVar3 = type->subtypes;
            if (((pxVar3 == (xmlSchemaTypePtr)0x0) || ((_xmlNode *)pxVar3->id == (_xmlNode *)0x0))
               || (*(xmlSchemaTypeType *)&((_xmlNode *)pxVar3->id)->_private != XML_SCHEMA_TYPE_ALL)
               ) {
              pxVar4 = pxVar15->subtypes;
              if (((pxVar4 == (xmlSchemaTypePtr)0x0) || ((int *)pxVar4->id == (int *)0x0)) ||
                 (*(int *)pxVar4->id != 8)) {
                if (bVar6 || pxVar4 == (xmlSchemaTypePtr)0x0) {
                  ((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children =
                       (xmlSchemaTreeItemPtr)pxVar4;
                  goto LAB_001a1f46;
                }
                local_40 = pxVar3;
                pxVar9 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
                bVar5 = true;
                if (pxVar9 == (xmlSchemaTypePtr)0x0) {
LAB_001a230c:
                  bVar6 = false;
                }
                else {
                  pxVar10 = xmlSchemaAddModelGroup
                                      (pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
                  pxVar9->id = (xmlChar *)pxVar10;
                  if (pxVar10 == (xmlSchemaModelGroupPtr)0x0) goto LAB_001a230c;
                  type->subtypes = pxVar9;
                  pxVar11 = xmlSchemaAddParticle
                                      (pctxt,type->node,*(int *)&pxVar15->subtypes->ref,
                                       *(int *)((long)&pxVar15->subtypes->ref + 4));
                  ((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children =
                       (xmlSchemaTreeItemPtr)pxVar11;
                  bVar6 = false;
                  if (pxVar11 != (xmlSchemaParticlePtr)0x0) {
                    pxVar11->children = (xmlSchemaTreeItemPtr_conflict)pxVar15->subtypes->id;
                    pxVar11->next = (xmlSchemaTreeItemPtr_conflict)local_40;
                    bVar6 = true;
                    bVar5 = false;
                  }
                }
                if (!bVar6) goto LAB_001a1f49;
                goto LAB_001a1f46;
              }
              node = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
              pcVar14 = 
              "A type cannot be derived by extension from a type which has an \'all\' model group in its {content type}, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
              ;
            }
            else {
              node = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
              pcVar14 = 
              "The type has an \'all\' model group in its {content type} and thus cannot be derived from a non-empty type, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
              ;
            }
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_COS_ALL_LIMITED,node,
                                (xmlSchemaBasicItemPtr)0x0,pcVar14,(xmlChar *)0x0,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
        else if ((uVar16 & 1) != 0 && !bVar5) {
LAB_001a1f3f:
          type->contentType = XML_SCHEMA_CONTENT_MIXED;
        }
LAB_001a1f46:
        bVar5 = false;
      }
LAB_001a1f49:
      if (bVar5) {
        if (!bVar5) {
          return 0;
        }
        goto LAB_001a221a;
      }
    }
LAB_001a2061:
    iVar7 = xmlSchemaFixupTypeAttributeUses(pctxt,type);
    if (iVar7 == -1) {
LAB_001a221a:
      pbVar1 = (byte *)((long)&type->flags + 2);
      *pbVar1 = *pbVar1 | 0x80;
      return -1;
    }
    if (iVar7 == 0) {
      iVar7 = xmlSchemaCheckCTComponent(pctxt,type);
      if (iVar7 == -1) goto LAB_001a221a;
      if (iVar7 == 0) {
        if (local_34 == pctxt->nberrors) {
          return 0;
        }
        goto LAB_001a20a4;
      }
    }
  }
  pbVar1 = (byte *)((long)&type->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
LAB_001a20a4:
  return pctxt->err;
}

Assistant:

static int
xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    int res = 0, olderrs = pctxt->nberrors;
    xmlSchemaTypePtr baseType = type->baseType;

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    if (baseType == NULL) {
	PERROR_INT("xmlSchemaFixupComplexType",
	    "missing baseType");
	goto exit_failure;
    }
    /*
    * Fixup the base type.
    */
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt);
    if (baseType->flags & XML_SCHEMAS_TYPE_INTERNAL_INVALID) {
	/*
	* Skip fixup if the base type is invalid.
	* TODO: Generate a warning!
	*/
	return(0);
    }
    /*
    * This basically checks if the base type can be derived.
    */
    res = xmlSchemaCheckSRCCT(pctxt, type);
    HFAILURE HERROR
    /*
    * Fixup the content type.
    */
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
	/*
	* Corresponds to <complexType><simpleContent>...
	*/
	if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentTypeDef != NULL) &&
	    (WXS_IS_RESTRICTION(type))) {
	    xmlSchemaTypePtr contentBase, content;
#ifdef ENABLE_NAMED_LOCALS
	    char buf[30];
	    const xmlChar *tmpname;
#endif
	    /*
	    * SPEC (1) If <restriction> + base type is <complexType>,
	    * "whose own {content type} is a simple type..."
	    */
	    if (type->contentTypeDef != NULL) {
		/*
		* SPEC (1.1) "the simple type definition corresponding to the
		* <simpleType> among the [children] of <restriction> if there
		* is one;"
		* Note that this "<simpleType> among the [children]" was put
		* into ->contentTypeDef during parsing.
		*/
		contentBase = type->contentTypeDef;
		type->contentTypeDef = NULL;
	    } else {
		/*
		* (1.2) "...otherwise (<restriction> has no <simpleType>
		* among its [children]), the simple type definition which
		* is the {content type} of the ... base type."
		*/
		contentBase = baseType->contentTypeDef;
	    }
	    /*
	    * SPEC
	    * "... a simple type definition which restricts the simple
	    * type definition identified in clause 1.1 or clause 1.2
	    * with a set of facet components"
	    *
	    * Create the anonymous simple type, which will be the content
	    * type of the complex type.
	    */
#ifdef ENABLE_NAMED_LOCALS
	    snprintf(buf, 29, "#scST%d", ++(pctxt->counter));
	    tmpname = xmlDictLookup(pctxt->dict, BAD_CAST buf, -1);
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, tmpname, type->targetNamespace,
		type->node, 0);
#else
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, NULL, type->targetNamespace,
		type->node, 0);
#endif
	    if (content == NULL)
		goto exit_failure;
	    /*
	    * We will use the same node as for the <complexType>
	    * to have it somehow anchored in the schema doc.
	    */
	    content->type = XML_SCHEMA_TYPE_SIMPLE;
	    content->baseType = contentBase;
	    /*
	    * Move the facets, previously anchored on the
	    * complexType during parsing.
	    */
	    content->facets = type->facets;
	    type->facets = NULL;
	    content->facetSet = type->facetSet;
	    type->facetSet = NULL;

	    type->contentTypeDef = content;
	    if (WXS_IS_TYPE_NOT_FIXED(contentBase))
		xmlSchemaTypeFixup(contentBase, ACTXT_CAST pctxt);
	    /*
	    * Fixup the newly created type. We don't need to check
	    * for circularity here.
	    */
	    res = xmlSchemaFixupSimpleTypeStageOne(pctxt, content);
	    HFAILURE HERROR
	    res = xmlSchemaFixupSimpleTypeStageTwo(pctxt, content);
	    HFAILURE HERROR

	} else if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	    (WXS_IS_RESTRICTION(type))) {
	    /*
	    * SPEC (2) If <restriction> + base is a mixed <complexType> with
	    * an emptiable particle, then a simple type definition which
	    * restricts the <restriction>'s <simpleType> child.
	    */
	    if ((type->contentTypeDef == NULL) ||
		(type->contentTypeDef->baseType == NULL)) {
		/*
		* TODO: Check if this ever happens.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <simpleContent><restriction> "
		    "is missing a <simpleType> child, but was not caught "
		    "by xmlSchemaCheckSRCCT()", type->name);
		goto exit_failure;
	    }
	} else if ((WXS_IS_COMPLEX(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (3) If <extension> + base is <complexType> with
	    * <simpleType> content, "...then the {content type} of that
	    * complex type definition"
	    */
	    if (baseType->contentTypeDef == NULL) {
		/*
		* TODO: Check if this ever happens. xmlSchemaCheckSRCCT
		* should have caught this already.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <extension>ed base type is "
		    "a complex type with no simple content type",
		    type->name);
		goto exit_failure;
	    }
	    type->contentTypeDef = baseType->contentTypeDef;
	} else if ((WXS_IS_SIMPLE(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (4) <extension> + base is <simpleType>
	    * "... then that simple type definition"
	    */
	    type->contentTypeDef = baseType;
	} else {
	    /*
	    * TODO: Check if this ever happens.
	    */
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_INTERNAL,
		WXS_BASIC_CAST type, NULL,
		"Internal error: xmlSchemaTypeFixup, "
		"complex type '%s' with <simpleContent>: unhandled "
		"derivation case", type->name);
	    goto exit_failure;
	}
    } else {
	int dummySequence = 0;
	xmlSchemaParticlePtr particle =
	    (xmlSchemaParticlePtr) type->subtypes;
	/*
	* Corresponds to <complexType><complexContent>...
	*
	* NOTE that the effective mixed was already set during parsing of
	* <complexType> and <complexContent>; its flag value is
	* XML_SCHEMAS_TYPE_MIXED.
	*
	* Compute the "effective content":
	* (2.1.1) + (2.1.2) + (2.1.3)
	*/
	if ((particle == NULL) ||
	    ((particle->type == XML_SCHEMA_TYPE_PARTICLE) &&
	    ((particle->children->type == XML_SCHEMA_TYPE_ALL) ||
	    (particle->children->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	    ((particle->children->type == XML_SCHEMA_TYPE_CHOICE) &&
	    (particle->minOccurs == 0))) &&
	    ( ((xmlSchemaTreeItemPtr) particle->children)->children == NULL))) {
	    if (type->flags & XML_SCHEMAS_TYPE_MIXED) {
		/*
		* SPEC (2.1.4) "If the `effective mixed` is true, then
		* a particle whose properties are as follows:..."
		*
		* Empty sequence model group with
		* minOccurs/maxOccurs = 1 (i.e. a "particle emptiable").
		* NOTE that we sill assign it the <complexType> node to
		* somehow anchor it in the doc.
		*/
		if ((particle == NULL) ||
		    (particle->children->type != XML_SCHEMA_TYPE_SEQUENCE)) {
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the model group.
		    */ /* URGENT TODO: avoid adding to pending items. */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;

		    type->subtypes = (xmlSchemaTypePtr) particle;
		}
		dummySequence = 1;
		type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	    } else {
		/*
		* SPEC (2.1.5) "otherwise empty"
		*/
		type->contentType = XML_SCHEMA_CONTENT_EMPTY;
	    }
	} else {
	    /*
	    * SPEC (2.2) "otherwise the particle corresponding to the
	    * <all>, <choice>, <group> or <sequence> among the
	    * [children]."
	    */
	    type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	}
	/*
	* Compute the "content type".
	*/
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * SPEC (3.1) "If <restriction>..."
	    * (3.1.1) + (3.1.2) */
	    if (type->contentType != XML_SCHEMA_CONTENT_EMPTY) {
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    }
	} else {
	    /*
	    * SPEC (3.2) "If <extension>..."
	    */
	    if (type->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.1)
		* "If the `effective content` is empty, then the
		*  {content type} of the [...] base ..."
		*/
		type->contentType = baseType->contentType;
		type->subtypes = baseType->subtypes;
		/*
		* Fixes bug #347316:
		* This is the case when the base type has a simple
		* type definition as content.
		*/
		type->contentTypeDef = baseType->contentTypeDef;
		/*
		* NOTE that the effective mixed is ignored here.
		*/
	    } else if (baseType->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.2)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    } else {
		/*
		* SPEC (3.2.3)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
		    /*
		    * "A model group whose {compositor} is sequence and whose
		    * {particles} are..."
		    */
		if ((WXS_TYPE_PARTICLE(type) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(type) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(type))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"The type has an 'all' model group in its "
			"{content type} and thus cannot be derived from "
			"a non-empty type, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((WXS_TYPE_PARTICLE(baseType) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(baseType) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(baseType))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"A type cannot be derived by extension from a type "
			"which has an 'all' model group in its "
			"{content type}, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((!dummySequence) && (baseType->subtypes != NULL)) {
		    xmlSchemaTreeItemPtr effectiveContent =
			(xmlSchemaTreeItemPtr) type->subtypes;
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the "sequence" model group.
		    */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;
		    WXS_TYPE_CONTENTTYPE(type) = (xmlSchemaTypePtr) particle;
		    /*
		    * SPEC "the particle of the {content type} of
		    * the ... base ..."
		    * Create a duplicate of the base type's particle
		    * and assign its "term" to it.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) xmlSchemaAddParticle(pctxt,
			type->node,
			((xmlSchemaParticlePtr) baseType->subtypes)->minOccurs,
			((xmlSchemaParticlePtr) baseType->subtypes)->maxOccurs);
		    if (particle->children->children == NULL)
			goto exit_failure;
		    particle = (xmlSchemaParticlePtr)
			particle->children->children;
		    particle->children =
			((xmlSchemaParticlePtr) baseType->subtypes)->children;
		    /*
		    * SPEC "followed by the `effective content`."
		    */
		    particle->next = effectiveContent;
		    /*
		    * This all will result in:
		    * new-particle
		    *   --> new-sequence(
		    *         new-particle
		    *           --> base-model,
		    *         this-particle
		    *	        --> this-model
		    *	    )
		    */
		} else {
		    /*
		    * This is the case when there is already an empty
		    * <sequence> with minOccurs==maxOccurs==1.
		    * Just add the base types's content type.
		    * NOTE that, although we miss to add an intermediate
		    * <sequence>, this should produce no difference to
		    * neither the regex compilation of the content model,
		    * nor to the complex type constraints.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) baseType->subtypes;
		}
	    }
	}
    }
    /*
    * Now fixup attribute uses:
    *   - expand attr. group references
    *     - intersect attribute wildcards
    *   - inherit attribute uses of the base type
    *   - inherit or union attr. wildcards if extending
    *   - apply attr. use prohibitions if restricting
    */
    res = xmlSchemaFixupTypeAttributeUses(pctxt, type);
    HFAILURE HERROR
    /*
    * Apply the complex type component constraints; this will not
    * check attributes, since this is done in
    * xmlSchemaFixupTypeAttributeUses().
    */
    res = xmlSchemaCheckCTComponent(pctxt, type);
    HFAILURE HERROR

    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    else
	return(0);

exit_error:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(pctxt->err);

exit_failure:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(-1);
}